

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O2

int template_put(void *closure,char *name,int escape,FILE *file)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  void **ppvVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  char prefix_str [46];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = strlen(name);
  if ((__n != 0 & *closure) == 1) {
    ppvVar5 = tommy_array_ref(*(tommy_array **)((long)closure + 8),
                              *(tommy_count_t *)((long)closure + 4));
    puVar2 = (uint *)*ppvVar5;
    iVar3 = strncmp("prefix",name,__n);
    if (iVar3 == 0) {
      lrtr_ip_addr_to_str(puVar2 + 1,prefix_str,0x2e);
      fputs(prefix_str,(FILE *)file);
      iVar3 = 0;
    }
    else {
      iVar3 = strncmp("length",name,__n);
      if (iVar3 == 0) {
        uVar6 = (ulong)(byte)puVar2[6];
      }
      else {
        iVar3 = strncmp("maxlen",name,__n);
        if (iVar3 == 0) {
          uVar6 = (ulong)*(byte *)((long)puVar2 + 0x19);
        }
        else {
          iVar4 = strncmp("origin",name,__n);
          iVar3 = 0;
          if (iVar4 != 0) goto LAB_001035ce;
          uVar6 = (ulong)*puVar2;
        }
      }
      iVar3 = 0;
      fprintf((FILE *)file,"%d",uVar6);
    }
  }
  else {
    iVar3 = -1;
  }
LAB_001035ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int template_put(void *closure, const char *name, __attribute__((unused)) int escape, FILE *file)
{
	struct exporter_state *state = closure;

	size_t namelen = strlen(name);

	if (!state->roa_section || namelen == 0)
		return MUSTACH_ERROR_SYSTEM;

	struct pfx_record *pfx_record = tommy_array_get(state->roas, state->current_roa);

	if (strncmp("prefix", name, namelen) == 0) {
		char prefix_str[INET6_ADDRSTRLEN];

		lrtr_ip_addr_to_str(&pfx_record->prefix, prefix_str, sizeof(prefix_str));
		fputs(prefix_str, file);

	} else if (strncmp("length", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->min_len);

	} else if (strncmp("maxlen", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->max_len);

	} else if (strncmp("origin", name, namelen) == 0) {
		fprintf(file, "%d", pfx_record->asn);
	}

	return MUSTACH_OK;
}